

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  uVar1;
  ParamIterator<aom_rc_mode> PVar2;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
  _Var3;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  _Var4;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false> _Var5;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  _Var6;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var7;
  char cVar8;
  int iVar9;
  ParamIterator<aom_rc_mode> PVar10;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  _Var11;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  _Var12;
  
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                        super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                        _M_head_impl.impl_ + 0x18))();
  uVar1._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                 super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                 _M_head_impl.impl_._M_t;
  if (uVar1._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )(this->end_).
        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .
        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .
        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
        .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
        super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>._M_head_impl.
        impl_) {
    cVar8 = (**(code **)(*(long *)uVar1._M_t.
                                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                                  ._M_head_impl + 0x30))();
    if (cVar8 == '\0') goto LAB_0053ec5f;
  }
  PVar10.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                  )(**(code **)(*(long *)(this->begin_).
                                         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>
                                         ._M_head_impl.impl_ + 0x20))();
  PVar2.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                 super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                 _M_head_impl.impl_;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
  super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>._M_head_impl.impl_ =
       PVar10.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
       _M_head_impl;
  if (PVar2.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)PVar2.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
              + 0x18))();
  _Var3._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
       ._M_head_impl;
  if (_Var3._M_head_impl !=
      ((ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      )._M_head_impl) {
    iVar9 = (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar9 == '\0') goto LAB_0053ec5f;
  }
  _Var11.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
        )(**(code **)(*(long *)(this->begin_).
                               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                               .
                               super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                               .
                               super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                               .
                               super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
                               ._M_head_impl.impl_._M_t.
                               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
                               .
                               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
                     + 0x20))();
  _Var4.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
  ;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
       = _Var11.
         super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
         ._M_head_impl;
  if (_Var4.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam> *)0x0)
  {
    (**(code **)(*(long *)_Var4.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
              + 0x18))();
  _Var5._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
       _M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       ._M_head_impl;
  if (_Var5._M_head_impl !=
      ((ParamIteratorInterface<libaom_test::TestMode> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
      _M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      )._M_head_impl) {
    iVar9 = (*(_Var5._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar9 == '\0') goto LAB_0053ec5f;
  }
  _Var12.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                  )(**(code **)(*(long *)(this->begin_).
                                         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                                         ._M_head_impl.impl_._M_t.
                                         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                         .
                                         super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                               + 0x20))();
  _Var6.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = _Var12.
         super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         ._M_head_impl;
  if (_Var6.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var6.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
              + 0x18))();
  _Var7._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if (_Var7._M_head_impl !=
      ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      )._M_head_impl) {
    (*(_Var7._M_head_impl)->_vptr_ParamIteratorInterface[6])();
  }
LAB_0053ec5f:
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }